

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea.c
# Opt level: O1

int CVodeInitB(void *cvode_mem,int which,CVRhsFnB fB,sunrealtype tB0,N_Vector yB0)

{
  int iVar1;
  undefined8 uVar2;
  int iVar3;
  int error_code;
  char *msgfmt;
  int *piVar4;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar3 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    iVar1 = 0x301;
  }
  else if (*(int *)((long)cvode_mem + 0xa78) == 0) {
    msgfmt = "Illegal attempt to call before calling CVodeAdjMalloc.";
    iVar3 = -0x65;
    error_code = -0x65;
    iVar1 = 0x30c;
  }
  else {
    if (which < *(int *)(*(long *)((long)cvode_mem + 0xa70) + 0x38)) {
      for (piVar4 = *(int **)(*(long *)((long)cvode_mem + 0xa70) + 0x30);
          (piVar4 != (int *)0x0 && (*piVar4 != which)); piVar4 = *(int **)(piVar4 + 0x1e)) {
      }
      iVar1 = CVodeInit(*(void **)(piVar4 + 4),CVArhs,tB0,yB0);
      if (iVar1 != 0) {
        return iVar1;
      }
      piVar4[6] = 0;
      *(CVRhsFnB *)(piVar4 + 8) = fB;
      *(sunrealtype *)(piVar4 + 2) = tB0;
      uVar2 = N_VClone(yB0);
      *(undefined8 *)(piVar4 + 0x1c) = uVar2;
      N_VScale(0x3ff0000000000000,yB0,uVar2);
      return 0;
    }
    msgfmt = "Illegal value for which.";
    iVar3 = -0x16;
    error_code = -0x16;
    iVar1 = 0x316;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,iVar1,"CVodeInitB",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodea.c"
                 ,msgfmt);
  return iVar3;
}

Assistant:

int CVodeInitB(void* cvode_mem, int which, CVRhsFnB fB, sunrealtype tB0,
               N_Vector yB0)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  void* cvodeB_mem;
  int flag;

  /* Check if cvode_mem exists */

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(CV_PROFILER);

  /* Was ASA initialized? */

  if (cv_mem->cv_adjMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_ADJ, __LINE__, __func__, __FILE__, MSGCV_NO_ADJ);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_NO_ADJ);
  }
  ca_mem = cv_mem->cv_adj_mem;

  /* Check the value of which */

  if (which >= ca_mem->ca_nbckpbs)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_WHICH);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_ILL_INPUT);
  }

  /* Find the CVodeBMem entry in the linked list corresponding to which */

  cvB_mem = ca_mem->cvB_mem;
  while (cvB_mem != NULL)
  {
    if (which == cvB_mem->cv_index) { break; }
    cvB_mem = cvB_mem->cv_next;
  }

  cvodeB_mem = (void*)(cvB_mem->cv_mem);

  /* Allocate and set the CVODES object */

  flag = CVodeInit(cvodeB_mem, CVArhs, tB0, yB0);

  if (flag != CV_SUCCESS)
  {
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (flag);
  }

  /* Copy fB function in cvB_mem */

  cvB_mem->cv_f_withSensi = SUNFALSE;
  cvB_mem->cv_f           = fB;

  /* Allocate space and initialize the y Nvector in cvB_mem */

  cvB_mem->cv_t0 = tB0;
  cvB_mem->cv_y  = N_VClone(yB0);
  N_VScale(ONE, yB0, cvB_mem->cv_y);

  SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
  return (CV_SUCCESS);
}